

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_erl_generator.cc
# Opt level: O2

string * __thiscall
t_erl_generator::render_includes_abi_cxx11_(string *__return_storage_ptr__,t_erl_generator *this)

{
  t_program *ptVar1;
  pointer pptVar2;
  pointer pptVar3;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ptVar1 = (this->super_t_generator).program_;
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_50);
  pptVar2 = (ptVar1->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (pptVar3 = (ptVar1->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; pptVar3 != pptVar2; pptVar3 = pptVar3 + 1
      ) {
    std::__cxx11::string::string((string *)&local_b0,(string *)&(*pptVar3)->name_);
    make_safe_for_module_name(&local_90,this,&local_b0);
    std::operator+(&local_70,"-include(\"",&local_90);
    std::operator+(&local_50,&local_70,"_types.hrl\").\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  if ((ptVar1->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (ptVar1->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_erl_generator::render_includes() {
  const vector<t_program*>& includes = program_->get_includes();
  string result = "";
  for (auto include : includes) {
    result += "-include(\"" + make_safe_for_module_name(include->get_name())
              + "_types.hrl\").\n";
  }
  if (includes.size() > 0) {
    result += "\n";
  }
  return result;
}